

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly_short_sample(poly *out,uint8_t *in)

{
  uint16_t uVar1;
  size_t i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 700; lVar2 = lVar2 + 1) {
    uVar1 = mod3((ushort)in[lVar2]);
    (out->field_0).v[lVar2] = (uVar1 >> 1 ^ 1) - 1 | uVar1;
  }
  (out->field_0).vectors[0x57][1] = 0;
  return;
}

Assistant:

static void poly_short_sample(struct poly *out,
                              const uint8_t in[HRSS_SAMPLE_BYTES]) {
  static_assert(HRSS_SAMPLE_BYTES == N - 1, "HRSS_SAMPLE_BYTES incorrect");
  for (size_t i = 0; i < N - 1; i++) {
    uint16_t v = mod3(in[i]);
    // Map {0, 1, 2} -> {0, 1, 0xffff}
    v |= ((v >> 1) ^ 1) - 1;
    out->v[i] = v;
  }
  out->v[N - 1] = 0;
  poly_normalize(out);
}